

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

HMODULE LoadLibraryExA(LPCSTR lpLibFileName,HANDLE hFile,DWORD dwFlags)

{
  char *lpPath;
  HMODULE pVVar1;
  DWORD dwErrCode;
  
  if (dwFlags != 0) {
    fprintf(_stderr,"] %s %s:%d","LoadLibraryExA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
            ,0xa3);
    fprintf(_stderr,"Needs Implementation!!!");
    return (HMODULE)0x0;
  }
  if (!PAL_InitializeChakraCoreCalled) goto LAB_0012c7a1;
  if (lpLibFileName == (LPCSTR)0x0) {
    dwErrCode = 0x7e;
LAB_0012c776:
    SetLastError(dwErrCode);
    lpPath = (char *)0x0;
    pVVar1 = (HMODULE)0x0;
  }
  else {
    if (*lpLibFileName == '\0') {
      dwErrCode = 0x57;
      goto LAB_0012c776;
    }
    lpPath = CorUnix::InternalStrdup(lpLibFileName);
    if (lpPath == (char *)0x0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_0012c7a1;
      dwErrCode = 8;
      goto LAB_0012c776;
    }
    FILEDosToUnixPathA(lpPath);
    pVVar1 = LOADLoadLibrary(lpPath,1);
  }
  if (lpPath != (char *)0x0) {
    CorUnix::InternalFree(lpPath);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return pVVar1;
  }
LAB_0012c7a1:
  abort();
}

Assistant:

HMODULE
PALAPI
LoadLibraryExA(
    IN LPCSTR lpLibFileName,
    IN /*Reserved*/ HANDLE hFile,
    IN DWORD dwFlags)
{
    if (dwFlags != 0)
    {
        // UNIXTODO: Implement this!
        ASSERT("Needs Implementation!!!");
        return nullptr;
    }

    LPSTR lpstr = nullptr;
    HMODULE hModule = nullptr;

    PERF_ENTRY(LoadLibraryA);
    ENTRY("LoadLibraryExA (lpLibFileName=%p (%s)) \n",
          (lpLibFileName) ? lpLibFileName : "NULL",
          (lpLibFileName) ? lpLibFileName : "NULL");

    if (!LOADVerifyLibraryPath(lpLibFileName))
    {
        goto Done;
    }

    /* do the Dos/Unix conversion on our own copy of the name */
    lpstr = InternalStrdup(lpLibFileName);
    if (!lpstr)
    {
        ERROR("InternalStrdup failure!\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        goto Done;
    }
    FILEDosToUnixPathA(lpstr);

    hModule = LOADLoadLibrary(lpstr, TRUE);

    /* let LOADLoadLibrary call SetLastError */
 Done:
    if (lpstr != nullptr)
    {
        InternalFree(lpstr);
    }

    LOGEXIT("LoadLibraryExA returns HMODULE %p\n", hModule);
    PERF_EXIT(LoadLibraryExA);
    return hModule;

}